

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O0

void save_load_header(vw *all,io_buf *model_file,bool read,bool text,string *file_options,
                     options_i *options)

{
  vw *pvVar1;
  bool bVar2;
  byte bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  int iVar6;
  uint32_t uVar7;
  size_t sVar8;
  ostream *poVar9;
  void *pvVar10;
  undefined2 *puVar11;
  difference_type dVar12;
  long lVar13;
  size_type sVar14;
  reference pvVar15;
  undefined8 uVar16;
  element_type *peVar17;
  stringstream *msg_00;
  byte in_CL;
  uint uVar18;
  byte in_DL;
  io_buf *in_RSI;
  long *in_RDI;
  string *in_R8;
  long *in_R9;
  stringstream __msg_1;
  uint32_t check_sum_saved;
  uint32_t check_sum;
  uint32_t len_2;
  string serialized_keep_options;
  shared_ptr<VW::config::base_option> *option;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  *__range3;
  options_serializer_boost_po serializer;
  stringstream __msg;
  size_t ret;
  uint32_t len_1;
  string temp_6;
  char skip [4];
  size_t i_4;
  uint32_t skip_len;
  string temp_5;
  char ngram [4];
  size_t i_3;
  uint32_t ngram_len;
  stringstream temp_4;
  uint32_t rank;
  string temp_3;
  uint32_t inter_len;
  size_t i_2;
  uint32_t len;
  string temp_2;
  char triple [4];
  size_t i_1;
  uint32_t triple_len;
  string temp_1;
  char pair [3];
  size_t i;
  uint32_t pair_len;
  stringstream temp;
  uint32_t local_num_bits;
  char model;
  stringstream msg;
  uint32_t v_length;
  size_t bytes_read_write;
  size_t buf2_size;
  char *buff2;
  undefined4 in_stack_ffffffffffffedcc;
  undefined7 in_stack_ffffffffffffedd0;
  undefined1 in_stack_ffffffffffffedd7;
  value_type *in_stack_ffffffffffffedd8;
  undefined1 uVar19;
  options_serializer_boost_po *in_stack_ffffffffffffede0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffede8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffedf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffedf8;
  undefined4 in_stack_ffffffffffffee00;
  undefined4 in_stack_ffffffffffffee04;
  uint32_t in_stack_ffffffffffffee08;
  undefined2 in_stack_ffffffffffffee0c;
  undefined1 in_stack_ffffffffffffee0e;
  undefined1 in_stack_ffffffffffffee0f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffee18;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffee20;
  const_iterator in_stack_ffffffffffffee28;
  long *plVar20;
  version_struct *in_stack_ffffffffffffee88;
  iterator in_stack_ffffffffffffef90;
  long *in_stack_ffffffffffffef98;
  iterator in_stack_ffffffffffffefa0;
  char **in_stack_ffffffffffffefa8;
  vw *in_stack_ffffffffffffefb0;
  io_buf *in_stack_ffffffffffffefb8;
  allocator *in_stack_ffffffffffffefc0;
  char *in_stack_ffffffffffffefc8;
  ostream *in_stack_ffffffffffffefd0;
  vw *in_stack_ffffffffffffefd8;
  io_buf *in_stack_ffffffffffffefe0;
  byte local_f51;
  byte local_ee1;
  stringstream local_e28 [16];
  ostream local_e18;
  uint32_t local_c9c;
  uint local_c98;
  uint local_c94;
  string local_c90 [32];
  string local_c70 [32];
  string local_c50 [32];
  reference local_c30;
  shared_ptr<VW::config::base_option> *local_c28;
  __normal_iterator<std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
  local_c20;
  undefined1 local_c18 [24];
  undefined1 *local_c00;
  string local_a68 [32];
  string local_a48 [39];
  undefined1 local_a21;
  stringstream local_a00 [16];
  ostream local_9f0;
  size_t local_878;
  uint local_86c;
  string local_868 [39];
  allocator local_841;
  string local_840 [36];
  char local_81c [4];
  ulong local_818;
  uint local_80c;
  string local_808 [39];
  allocator local_7e1;
  string local_7e0 [36];
  char local_7bc [4];
  ulong local_7b8;
  uint local_7ac;
  string local_7a8 [32];
  string local_788 [32];
  stringstream local_768 [16];
  undefined1 local_758 [383];
  allocator local_5d9;
  string local_5d8 [36];
  uint local_5b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_570;
  allocator local_559;
  string local_558 [36];
  uint local_534;
  ulong local_530;
  uint local_524;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_518;
  allocator local_509;
  string local_508 [36];
  undefined2 local_4e4;
  undefined1 local_4e2;
  ulong local_4e0;
  uint local_4d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c8;
  allocator local_4b9;
  string local_4b8 [36];
  undefined2 local_494 [2];
  ulong local_490;
  uint local_484;
  string local_480 [32];
  string local_460 [32];
  stringstream local_440 [16];
  undefined1 local_430 [381];
  byte local_2b3;
  byte local_2b2;
  allocator local_2b1;
  string local_2b0 [32];
  uint local_290;
  undefined1 local_289;
  string local_288 [37];
  byte local_263;
  byte local_262;
  allocator local_261;
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  stringstream local_200 [16];
  ostream local_1f0;
  string local_78 [36];
  uint local_54;
  char *local_50;
  size_t local_38;
  vw *local_30;
  long *local_28;
  string *local_20;
  byte local_12;
  byte local_11;
  io_buf *local_10;
  long *local_8;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_28 = in_R9;
  local_20 = in_R8;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = (vw *)malloc(0x200);
  local_38 = 0x200;
  sVar8 = v_array<int>::size(&local_10->files);
  if (sVar8 != 0) {
    local_50 = (char *)0x0;
    version_struct::to_string_abi_cxx11_(in_stack_ffffffffffffee88);
    iVar6 = std::__cxx11::string::length();
    std::__cxx11::string::~string(local_78);
    local_54 = iVar6 + 1;
    std::__cxx11::stringstream::stringstream(local_200);
    poVar9 = std::operator<<(&local_1f0,"Version ");
    version_struct::to_string_abi_cxx11_(in_stack_ffffffffffffee88);
    poVar9 = std::operator<<(poVar9,local_220);
    std::operator<<(poVar9,"\n");
    std::__cxx11::string::~string(local_220);
    pvVar1 = local_30;
    version_struct::to_string_abi_cxx11_(in_stack_ffffffffffffee88);
    pvVar10 = (void *)std::__cxx11::string::c_str();
    sVar8 = min((ulong)local_54,local_38);
    memcpy(pvVar1,pvVar10,sVar8);
    std::__cxx11::string::~string(local_240);
    pvVar1 = local_30;
    if ((local_11 & 1) != 0) {
      local_54 = (uint)local_38;
      sVar8 = min(local_38 & 0xffffffff,0x200);
      *(undefined1 *)((long)pvVar1 + (sVar8 - 1)) = 0;
    }
    uVar18 = local_12 & 1;
    sVar8 = bin_text_read_write((io_buf *)
                                CONCAT17(in_stack_ffffffffffffee0f,
                                         CONCAT16(in_stack_ffffffffffffee0e,
                                                  CONCAT24(in_stack_ffffffffffffee0c,
                                                           in_stack_ffffffffffffee08))),
                                (char *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00
                                                ),(size_t)in_stack_ffffffffffffedf8,
                                (char *)in_stack_ffffffffffffedf0._M_current,
                                SUB81((ulong)in_stack_ffffffffffffede8._M_current >> 0x38,0),
                                (stringstream *)in_stack_ffffffffffffede0,
                                SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
    local_50 = (char *)((long)local_50 + sVar8);
    version_struct::operator=
              ((version_struct *)CONCAT17(in_stack_ffffffffffffedd7,in_stack_ffffffffffffedd0),
               (char *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
    VW::validate_version(in_stack_ffffffffffffefb0);
    bVar2 = version_struct::operator>=
                      ((version_struct *)in_stack_ffffffffffffedf0._M_current,
                       (char *)in_stack_ffffffffffffede8._M_current);
    if (bVar2) {
      io_buf::verify_hash(local_10,true);
    }
    bVar2 = version_struct::operator>=
                      ((version_struct *)in_stack_ffffffffffffedf0._M_current,
                       (char *)in_stack_ffffffffffffede8._M_current);
    if (bVar2) {
      iVar6 = std::__cxx11::string::length();
      local_54 = iVar6 + 1;
      poVar9 = std::operator<<(&local_1f0,"Id ");
      poVar9 = std::operator<<(poVar9,(string *)(local_8 + 0x14));
      std::operator<<(poVar9,"\n");
      pvVar1 = local_30;
      pvVar10 = (void *)std::__cxx11::string::c_str();
      sVar8 = min((ulong)local_54,0x200);
      memcpy(pvVar1,pvVar10,sVar8);
      if ((local_11 & 1) != 0) {
        local_54 = 0x200;
      }
      sVar8 = bin_text_read_write((io_buf *)
                                  CONCAT17(in_stack_ffffffffffffee0f,
                                           CONCAT16(in_stack_ffffffffffffee0e,
                                                    CONCAT24(in_stack_ffffffffffffee0c,
                                                             in_stack_ffffffffffffee08))),
                                  (char *)CONCAT44(in_stack_ffffffffffffee04,
                                                   in_stack_ffffffffffffee00),
                                  (size_t)in_stack_ffffffffffffedf8,
                                  (char *)in_stack_ffffffffffffedf0._M_current,
                                  SUB81((ulong)in_stack_ffffffffffffede8._M_current >> 0x38,0),
                                  (stringstream *)in_stack_ffffffffffffede0,
                                  SUB81((ulong)in_stack_ffffffffffffedd8 >> 0x38,0));
      local_50 = (char *)((long)local_50 + sVar8);
      std::__cxx11::string::operator=((string *)(local_8 + 0x14),(char *)local_30);
      plVar20 = local_28;
      local_262 = 0;
      local_263 = 0;
      local_ee1 = 0;
      if ((local_11 & 1) != 0) {
        std::allocator<char>::allocator();
        local_262 = 1;
        std::__cxx11::string::string(local_260,"id",&local_261);
        local_263 = 1;
        bVar3 = (**(code **)(*plVar20 + 8))(plVar20,local_260);
        local_ee1 = 0;
        if ((bVar3 & 1) == 0) {
          local_ee1 = std::__cxx11::string::empty();
          local_ee1 = local_ee1 ^ 0xff;
        }
      }
      if ((local_263 & 1) != 0) {
        std::__cxx11::string::~string(local_260);
      }
      if ((local_262 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_261);
      }
      if ((local_ee1 & 1) != 0) {
        std::__cxx11::string::operator+=(local_20," --id");
        std::operator+((char *)in_stack_ffffffffffffee18._M_current,in_stack_ffffffffffffee10);
        std::__cxx11::string::operator+=(local_20,local_288);
        std::__cxx11::string::~string(local_288);
      }
    }
    local_289 = 0x6d;
    sVar8 = bin_text_read_write_fixed_validated
                      (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                       (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                       SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                       (stringstream *)in_stack_ffffffffffffefb8,
                       SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
    local_50 = (char *)((long)local_50 + sVar8);
    poVar9 = std::operator<<(&local_1f0,"Min label:");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(float *)(*local_8 + 0x68));
    std::operator<<(poVar9,"\n");
    sVar8 = bin_text_read_write_fixed_validated
                      (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                       (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                       SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                       (stringstream *)in_stack_ffffffffffffefb8,
                       SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
    local_50 = (char *)((long)local_50 + sVar8);
    poVar9 = std::operator<<(&local_1f0,"Max label:");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(float *)(*local_8 + 0x6c));
    std::operator<<(poVar9,"\n");
    sVar8 = bin_text_read_write_fixed_validated
                      (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                       (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                       SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                       (stringstream *)in_stack_ffffffffffffefb8,
                       SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
    local_50 = (char *)((long)local_50 + sVar8);
    poVar9 = std::operator<<(&local_1f0,"bits:");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(uint *)(local_8 + 10));
    std::operator<<(poVar9,"\n");
    local_290 = *(uint *)(local_8 + 10);
    sVar8 = bin_text_read_write_fixed_validated
                      (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                       (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                       SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                       (stringstream *)in_stack_ffffffffffffefb8,
                       SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
    plVar20 = local_28;
    local_50 = (char *)(sVar8 + (long)local_50);
    local_2b2 = 0;
    local_2b3 = 0;
    local_f51 = 0;
    if ((local_11 & 1) != 0) {
      std::allocator<char>::allocator();
      local_2b2 = 1;
      std::__cxx11::string::string(local_2b0,"bit_precision",&local_2b1);
      local_2b3 = 1;
      local_f51 = (**(code **)(*plVar20 + 8))(plVar20,local_2b0);
      local_f51 = local_f51 ^ 0xff;
    }
    if ((local_2b3 & 1) != 0) {
      std::__cxx11::string::~string(local_2b0);
    }
    if ((local_2b2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    }
    if ((local_f51 & 1) != 0) {
      std::__cxx11::string::operator+=(local_20," --bit_precision");
      std::__cxx11::stringstream::stringstream(local_440);
      std::ostream::operator<<(local_430,local_290);
      std::__cxx11::stringstream::str();
      std::operator+((char *)in_stack_ffffffffffffedd8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffedd7,in_stack_ffffffffffffedd0));
      std::__cxx11::string::operator+=(local_20,local_460);
      std::__cxx11::string::~string(local_460);
      std::__cxx11::string::~string(local_480);
      std::__cxx11::stringstream::~stringstream(local_440);
    }
    VW::validate_default_bits
              (in_stack_ffffffffffffefb0,(uint32_t)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
    *(undefined1 *)((long)local_8 + 0x54) = 0;
    *(uint *)(local_8 + 10) = local_290;
    VW::validate_num_bits((vw *)in_stack_ffffffffffffefa0._M_current);
    bVar2 = version_struct::operator<
                      ((version_struct *)in_stack_ffffffffffffedf0._M_current,
                       (char *)in_stack_ffffffffffffede8._M_current);
    if (bVar2) {
      sVar14 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_8 + 0x70));
      local_484 = (uint)sVar14;
      poVar9 = (ostream *)std::ostream::operator<<(&local_1f0,local_484);
      std::operator<<(poVar9," pairs: ");
      sVar8 = bin_text_read_write_fixed_validated
                        (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                         (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                         SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                         (stringstream *)in_stack_ffffffffffffefb8,
                         SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
      local_50 = local_50 + sVar8;
      for (local_490 = 0; local_490 < local_484; local_490 = local_490 + 1) {
        memset(local_494,0,3);
        if ((local_11 & 1) == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_8 + 0x70),local_490);
          puVar11 = (undefined2 *)std::__cxx11::string::c_str();
          local_494[0] = *puVar11;
          pvVar15 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)(local_8 + 0x70),local_490);
          poVar9 = std::operator<<(&local_1f0,(string *)pvVar15);
          std::operator<<(poVar9," ");
        }
        uVar18 = local_12 & 1;
        sVar8 = bin_text_read_write_fixed_validated
                          (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                           (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                           SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                           (stringstream *)in_stack_ffffffffffffefb8,
                           SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
        local_50 = local_50 + sVar8;
        if ((local_11 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_4b8,(char *)local_494,&local_4b9);
          std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
          local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
          local_4d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
          dVar12 = std::
                   count<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                             (in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffede0);
          if (dVar12 == 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
          }
          std::__cxx11::string::~string(local_4b8);
        }
      }
      std::operator<<(&local_1f0,"\n");
      sVar8 = bin_text_read_write_fixed_validated
                        (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                         (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                         SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                         (stringstream *)in_stack_ffffffffffffefb8,
                         SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
      local_50 = local_50 + sVar8;
      sVar14 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_8 + 0x73));
      local_4d4 = (uint)sVar14;
      poVar9 = (ostream *)std::ostream::operator<<(&local_1f0,local_4d4);
      std::operator<<(poVar9," triples: ");
      sVar8 = bin_text_read_write_fixed_validated
                        (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                         (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                         SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                         (stringstream *)in_stack_ffffffffffffefb8,
                         SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
      local_50 = local_50 + sVar8;
      for (local_4e0 = 0; local_4e0 < local_4d4; local_4e0 = local_4e0 + 1) {
        memset(&local_4e4,0,4);
        if ((local_11 & 1) == 0) {
          pvVar15 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)(local_8 + 0x73),local_4e0);
          poVar9 = std::operator<<(&local_1f0,(string *)pvVar15);
          std::operator<<(poVar9," ");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_8 + 0x73),local_4e0);
          puVar11 = (undefined2 *)std::__cxx11::string::c_str();
          local_4e4 = *puVar11;
          local_4e2 = *(undefined1 *)(puVar11 + 1);
        }
        uVar18 = local_12 & 1;
        sVar8 = bin_text_read_write_fixed_validated
                          (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                           (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                           SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                           (stringstream *)in_stack_ffffffffffffefb8,
                           SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
        local_50 = local_50 + sVar8;
        if ((local_11 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_508,(char *)&local_4e4,&local_509);
          std::allocator<char>::~allocator((allocator<char> *)&local_509);
          local_518 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
          local_520 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
          dVar12 = std::
                   count<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                             (in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffede0);
          if (dVar12 == 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
          }
          std::__cxx11::string::~string(local_508);
        }
      }
      std::operator<<(&local_1f0,"\n");
      uVar18 = local_12 & 1;
      sVar8 = bin_text_read_write_fixed_validated
                        (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                         (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                         SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                         (stringstream *)in_stack_ffffffffffffefb8,
                         SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
      local_50 = local_50 + sVar8;
      bVar2 = version_struct::operator>=
                        ((version_struct *)in_stack_ffffffffffffedf0._M_current,
                         (char *)in_stack_ffffffffffffede8._M_current);
      if (bVar2) {
        sVar14 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_8 + 0x6d));
        local_524 = (uint)sVar14;
        poVar9 = (ostream *)std::ostream::operator<<(&local_1f0,local_524);
        std::operator<<(poVar9," interactions: ");
        sVar8 = bin_text_read_write_fixed_validated
                          (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                           (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                           SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                           (stringstream *)in_stack_ffffffffffffefb8,
                           SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
        local_50 = local_50 + sVar8;
        for (local_530 = 0; local_530 < local_524; local_530 = local_530 + 1) {
          local_534 = 0;
          if ((local_11 & 1) == 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(local_8 + 0x6d),local_530);
            local_534 = std::__cxx11::string::size();
            poVar9 = std::operator<<(&local_1f0,"len: ");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_534);
            std::operator<<(poVar9," ");
          }
          in_stack_ffffffffffffefe0 =
               (io_buf *)
               bin_text_read_write_fixed_validated
                         (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                          (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                          SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                          (stringstream *)in_stack_ffffffffffffefb8,
                          SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
          local_50 = local_50 + (long)&in_stack_ffffffffffffefe0->_vptr_io_buf;
          if ((local_11 & 1) == 0) {
            in_stack_ffffffffffffefd8 = local_30;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(local_8 + 0x6d),local_530);
            pvVar10 = (void *)std::__cxx11::string::c_str();
            memcpy(in_stack_ffffffffffffefd8,pvVar10,(ulong)local_534);
            std::operator<<(&local_1f0,"interaction: ");
            in_stack_ffffffffffffefd0 = &local_1f0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(local_8 + 0x6d),local_530);
            lVar13 = std::__cxx11::string::c_str();
            std::ostream::write((char *)in_stack_ffffffffffffefd0,lVar13);
          }
          in_stack_ffffffffffffefc8 =
               (char *)bin_text_read_write_fixed_validated
                                 (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                                  (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                                  SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                                  (stringstream *)in_stack_ffffffffffffefb8,
                                  SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
          local_50 = in_stack_ffffffffffffefc8 + (long)local_50;
          if ((local_11 & 1) != 0) {
            in_stack_ffffffffffffefb8 = (io_buf *)(ulong)local_534;
            in_stack_ffffffffffffefc0 = &local_559;
            in_stack_ffffffffffffefb0 = local_30;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_558,(char *)in_stack_ffffffffffffefb0,(ulong)in_stack_ffffffffffffefb8,
                       in_stack_ffffffffffffefc0);
            std::allocator<char>::~allocator((allocator<char> *)&local_559);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
            std::__cxx11::string::~string(local_558);
          }
        }
        std::operator<<(&local_1f0,"\n");
        in_stack_ffffffffffffefa8 =
             (char **)bin_text_read_write_fixed_validated
                                (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                                 (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                                 SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                                 (stringstream *)in_stack_ffffffffffffefb8,
                                 SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
        local_50 = (char *)((long)in_stack_ffffffffffffefa8 + (long)local_50);
      }
      else {
        in_stack_ffffffffffffef98 = local_8 + 0x6d;
        in_stack_ffffffffffffefa0 =
             std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
        local_570 = in_stack_ffffffffffffefa0._M_current;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffffedd7,in_stack_ffffffffffffedd0),
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
        in_stack_ffffffffffffef90 =
             std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
        local_578 = in_stack_ffffffffffffef90._M_current;
        local_580 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
        local_588 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_ffffffffffffee10,in_stack_ffffffffffffee28,
                               in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
        local_598 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffffedd7,in_stack_ffffffffffffedd0),
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
        local_5a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
        local_5a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
        local_5b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_ffffffffffffee10,in_stack_ffffffffffffee28,
                               in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
      }
    }
    bVar2 = version_struct::operator<=
                      ((version_struct *)in_stack_ffffffffffffedf0._M_current,
                       (char *)in_stack_ffffffffffffede8._M_current);
    if (bVar2) {
      local_5b4 = 0;
      poVar9 = std::operator<<(&local_1f0,"rank:");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_5b4);
      std::operator<<(poVar9,"\n");
      sVar8 = bin_text_read_write_fixed_validated
                        (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                         (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                         SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                         (stringstream *)in_stack_ffffffffffffefb8,
                         SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
      plVar20 = local_28;
      local_50 = local_50 + sVar8;
      if (local_5b4 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5d8,"rank",&local_5d9);
        bVar3 = (**(code **)(*plVar20 + 8))(plVar20,local_5d8);
        std::__cxx11::string::~string(local_5d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
        if (((bVar3 ^ 0xff) & 1) == 0) {
          poVar9 = std::operator<<((ostream *)(local_8 + 0x1c),
                                   "WARNING: this model file contains \'rank: ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_5b4);
          poVar9 = std::operator<<(poVar9,
                                   "\' value but it will be ignored as another value specified via the command line."
                                  );
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
        else {
          std::__cxx11::string::operator+=(local_20," --rank");
          std::__cxx11::stringstream::stringstream(local_768);
          std::ostream::operator<<(local_758,local_5b4);
          std::__cxx11::stringstream::str();
          std::operator+((char *)in_stack_ffffffffffffedd8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffedd7,in_stack_ffffffffffffedd0));
          std::__cxx11::string::operator+=(local_20,local_788);
          std::__cxx11::string::~string(local_788);
          std::__cxx11::string::~string(local_7a8);
          std::__cxx11::stringstream::~stringstream(local_768);
        }
      }
    }
    poVar9 = std::operator<<(&local_1f0,"lda:");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(uint *)(local_8 + 0x68f));
    std::operator<<(poVar9,"\n");
    sVar8 = bin_text_read_write_fixed_validated
                      (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                       (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                       SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                       (stringstream *)in_stack_ffffffffffffefb8,
                       SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
    local_50 = local_50 + sVar8;
    sVar14 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_8 + 0xd7));
    local_7ac = (uint)sVar14;
    poVar9 = (ostream *)std::ostream::operator<<(&local_1f0,local_7ac);
    std::operator<<(poVar9," ngram:");
    sVar8 = bin_text_read_write_fixed_validated
                      (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                       (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                       SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                       (stringstream *)in_stack_ffffffffffffefb8,
                       SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
    local_50 = local_50 + sVar8;
    for (local_7b8 = 0; local_7b8 < local_7ac; local_7b8 = local_7b8 + 1) {
      memset(local_7bc,0,4);
      if ((local_11 & 1) == 0) {
        pvVar15 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(local_8 + 0xd7),local_7b8);
        poVar9 = std::operator<<(&local_1f0,(string *)pvVar15);
        std::operator<<(poVar9," ");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_8 + 0xd7),local_7b8);
        pvVar10 = (void *)std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_8 + 0xd7),local_7b8);
        sVar8 = std::__cxx11::string::size();
        sVar8 = min(3,sVar8);
        memcpy(local_7bc,pvVar10,sVar8);
      }
      sVar8 = bin_text_read_write_fixed_validated
                        (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                         (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                         SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                         (stringstream *)in_stack_ffffffffffffefb8,
                         SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
      local_50 = local_50 + sVar8;
      if ((local_11 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_7e0,local_7bc,&local_7e1);
        std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
        std::__cxx11::string::operator+=(local_20," --ngram");
        std::operator+((char *)in_stack_ffffffffffffee18._M_current,in_stack_ffffffffffffee10);
        std::__cxx11::string::operator+=(local_20,local_808);
        std::__cxx11::string::~string(local_808);
        std::__cxx11::string::~string(local_7e0);
      }
    }
    std::operator<<(&local_1f0,"\n");
    sVar8 = bin_text_read_write_fixed_validated
                      (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                       (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                       SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                       (stringstream *)in_stack_ffffffffffffefb8,
                       SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
    local_50 = local_50 + sVar8;
    sVar14 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_8 + 0xda));
    local_80c = (uint)sVar14;
    poVar9 = (ostream *)std::ostream::operator<<(&local_1f0,local_80c);
    std::operator<<(poVar9," skip:");
    sVar8 = bin_text_read_write_fixed_validated
                      (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                       (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                       SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                       (stringstream *)in_stack_ffffffffffffefb8,
                       SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
    local_50 = local_50 + sVar8;
    for (local_818 = 0; uVar19 = (undefined1)((ulong)in_stack_ffffffffffffefc0 >> 0x38),
        local_818 < local_80c; local_818 = local_818 + 1) {
      memset(local_81c,0,4);
      if ((local_11 & 1) == 0) {
        pvVar15 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(local_8 + 0xda),local_818);
        poVar9 = std::operator<<(&local_1f0,(string *)pvVar15);
        std::operator<<(poVar9," ");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_8 + 0xda),local_818);
        pvVar10 = (void *)std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_8 + 0xda),local_818);
        sVar8 = std::__cxx11::string::size();
        sVar8 = min(3,sVar8);
        memcpy(local_81c,pvVar10,sVar8);
      }
      sVar8 = bin_text_read_write_fixed_validated
                        (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                         (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                         SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0),
                         (stringstream *)in_stack_ffffffffffffefb8,
                         SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
      local_50 = local_50 + sVar8;
      if ((local_11 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_840,local_81c,&local_841);
        std::allocator<char>::~allocator((allocator<char> *)&local_841);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
        std::__cxx11::string::operator+=(local_20," --skips");
        std::operator+((char *)in_stack_ffffffffffffee18._M_current,in_stack_ffffffffffffee10);
        std::__cxx11::string::operator+=(local_20,local_868);
        std::__cxx11::string::~string(local_868);
        std::__cxx11::string::~string(local_840);
      }
    }
    std::operator<<(&local_1f0,"\n");
    uVar18 = local_12 & 1;
    sVar8 = bin_text_read_write_fixed_validated
                      (in_stack_ffffffffffffefe0,(char *)in_stack_ffffffffffffefd8,
                       (size_t)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,(bool)uVar19,
                       (stringstream *)in_stack_ffffffffffffefb8,
                       SUB81((ulong)in_stack_ffffffffffffefb0 >> 0x38,0));
    local_50 = local_50 + sVar8;
    if ((local_11 & 1) == 0) {
      VW::config::options_serializer_boost_po::options_serializer_boost_po
                (in_stack_ffffffffffffede0);
      (**(code **)(*local_28 + 0x18))(local_c18);
      local_c00 = local_c18;
      local_c20._M_current =
           (shared_ptr<VW::config::base_option> *)
           std::
           vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
           ::begin((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
                    *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
      local_c28 = (shared_ptr<VW::config::base_option> *)
                  std::
                  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
                  ::end((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
                         *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffedd7,in_stack_ffffffffffffedd0),
                                (__normal_iterator<std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffedcc,uVar18)), bVar2) {
        local_c30 = __gnu_cxx::
                    __normal_iterator<std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
                    ::operator*(&local_c20);
        peVar17 = std::
                  __shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x365517);
        if ((peVar17->m_keep & 1U) != 0) {
          plVar20 = local_28;
          peVar17 = std::
                    __shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x36553b);
          bVar3 = (**(code **)(*plVar20 + 8))(plVar20,&peVar17->m_name);
          if ((bVar3 & 1) != 0) {
            std::
            __shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)CONCAT17(in_stack_ffffffffffffedd7,in_stack_ffffffffffffedd0));
            VW::config::options_serializer_boost_po::add
                      ((options_serializer_boost_po *)
                       CONCAT17(in_stack_ffffffffffffedd7,in_stack_ffffffffffffedd0),
                       (base_option *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
          }
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
        ::operator++(&local_c20);
      }
      std::
      vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
      ::~vector((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
                 *)in_stack_ffffffffffffede0);
      VW::config::options_serializer_boost_po::str_abi_cxx11_
                ((options_serializer_boost_po *)CONCAT44(in_stack_ffffffffffffedcc,uVar18));
      if (((*(byte *)((long)local_8 + 0x9e) & 1) != 0) && (local_8[0x689] != 0)) {
        std::__cxx11::string::operator+=(local_c50," --random_seed");
        std::__cxx11::to_string
                  (CONCAT17(in_stack_ffffffffffffee0f,
                            CONCAT16(in_stack_ffffffffffffee0e,
                                     CONCAT24(in_stack_ffffffffffffee0c,in_stack_ffffffffffffee08)))
                  );
        std::operator+((char *)in_stack_ffffffffffffedd8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffedd7,in_stack_ffffffffffffedd0));
        std::__cxx11::string::operator+=(local_c50,local_c70);
        std::__cxx11::string::~string(local_c70);
        std::__cxx11::string::~string(local_c90);
      }
      poVar9 = std::operator<<(&local_1f0,"options:");
      poVar9 = std::operator<<(poVar9,local_c50);
      std::operator<<(poVar9,"\n");
      local_c94 = std::__cxx11::string::length();
      if (local_c94 != 0) {
        std::__cxx11::string::c_str();
        safe_memcpy((char **)in_stack_ffffffffffffede0,(size_t *)in_stack_ffffffffffffedd8,
                    (void *)CONCAT17(in_stack_ffffffffffffedd7,in_stack_ffffffffffffedd0),
                    CONCAT44(in_stack_ffffffffffffedcc,uVar18));
      }
      *(undefined1 *)((long)&local_30->sd + (ulong)local_c94) = 0;
      uVar19 = (undefined1)((ulong)in_stack_ffffffffffffedd8 >> 0x38);
      in_stack_ffffffffffffee10 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           bin_text_read_write((io_buf *)
                               CONCAT17(in_stack_ffffffffffffee0f,
                                        CONCAT16(in_stack_ffffffffffffee0e,
                                                 CONCAT24(in_stack_ffffffffffffee0c,
                                                          in_stack_ffffffffffffee08))),
                               (char *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00)
                               ,(size_t)in_stack_ffffffffffffedf8,
                               in_stack_ffffffffffffedf0._M_current,
                               SUB81((ulong)in_stack_ffffffffffffede8._M_current >> 0x38,0),
                               (stringstream *)in_stack_ffffffffffffede0,(bool)uVar19);
      local_50 = local_50 + (long)&in_stack_ffffffffffffee10->_M_dataplus;
      std::__cxx11::string::~string(local_c50);
      VW::config::options_serializer_boost_po::~options_serializer_boost_po
                ((options_serializer_boost_po *)0x365812);
    }
    else {
      local_878 = io_buf::bin_read_fixed
                            (in_stack_ffffffffffffefb8,(char *)in_stack_ffffffffffffefb0,
                             (size_t)in_stack_ffffffffffffefa8,
                             (char *)in_stack_ffffffffffffefa0._M_current);
      if ((0x6400000 < local_86c) || (local_878 < 4)) {
        std::__cxx11::stringstream::stringstream(local_a00);
        iVar6 = (int)((ulong)in_stack_ffffffffffffedf0._M_current >> 0x20);
        std::operator<<(&local_9f0,"bad model format!");
        local_a21 = 1;
        uVar16 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  ((vw_exception *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                   (char *)in_stack_ffffffffffffedf8,iVar6,in_stack_ffffffffffffede8._M_current);
        local_a21 = 0;
        __cxa_throw(uVar16,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      resize_buf_if_needed
                (in_stack_ffffffffffffefa8,(size_t *)in_stack_ffffffffffffefa0._M_current,
                 (size_t)in_stack_ffffffffffffef98);
      sVar8 = io_buf::bin_read_fixed
                        (in_stack_ffffffffffffefb8,(char *)in_stack_ffffffffffffefb0,
                         (size_t)in_stack_ffffffffffffefa8,
                         (char *)in_stack_ffffffffffffefa0._M_current);
      local_50 = local_50 + sVar8 + local_878;
      if (local_86c != 0) {
        std::operator+(in_stack_ffffffffffffedf8,(char *)in_stack_ffffffffffffedf0._M_current);
        std::operator+(in_stack_ffffffffffffedd8,
                       (char *)CONCAT17(in_stack_ffffffffffffedd7,in_stack_ffffffffffffedd0));
        std::__cxx11::string::operator=(local_20,local_a48);
        std::__cxx11::string::~string(local_a48);
        std::__cxx11::string::~string(local_a68);
      }
      uVar19 = (undefined1)((ulong)in_stack_ffffffffffffedd8 >> 0x38);
    }
    uVar4 = version_struct::operator>=
                      ((version_struct *)in_stack_ffffffffffffedf0._M_current,
                       (char *)in_stack_ffffffffffffede8._M_current);
    if ((bool)uVar4) {
      uVar5 = version_struct::operator>=
                        ((version_struct *)in_stack_ffffffffffffedf0._M_current,
                         (char *)in_stack_ffffffffffffede8._M_current);
      if ((bool)uVar5) {
        uVar7 = io_buf::hash((io_buf *)in_stack_ffffffffffffef90._M_current);
        in_stack_ffffffffffffee08 = uVar7;
      }
      else {
        in_stack_ffffffffffffedf8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             v_array<char>::begin(&local_10->space);
        in_stack_ffffffffffffedf0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             uniform_hash(in_stack_ffffffffffffee10,
                          CONCAT17(uVar4,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffee0c,
                                                                 in_stack_ffffffffffffee08))),
                          CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00));
        uVar7 = (uint32_t)in_stack_ffffffffffffedf0._M_current;
      }
      local_c9c = uVar7;
      local_c98 = uVar7;
      in_stack_ffffffffffffede8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(&local_1f0,"Checksum: ");
      msg_00 = (stringstream *)
               std::ostream::operator<<(in_stack_ffffffffffffede8._M_current,local_c98);
      std::operator<<((ostream *)msg_00,"\n");
      bin_text_read_write((io_buf *)
                          CONCAT17(uVar4,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffee0c,
                                                                 in_stack_ffffffffffffee08))),
                          (char *)CONCAT44(uVar7,in_stack_ffffffffffffee00),
                          (size_t)in_stack_ffffffffffffedf8,
                          (char *)in_stack_ffffffffffffedf0._M_current,
                          SUB81((ulong)in_stack_ffffffffffffede8._M_current >> 0x38,0),msg_00,
                          (bool)uVar19);
      if (local_c9c != local_c98) {
        std::__cxx11::stringstream::stringstream(local_e28);
        iVar6 = (int)((ulong)in_stack_ffffffffffffedf0._M_current >> 0x20);
        std::operator<<(&local_e18,"Checksum is inconsistent, file is possibly corrupted.");
        uVar16 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  ((vw_exception *)CONCAT44(uVar7,in_stack_ffffffffffffee00),
                   (char *)in_stack_ffffffffffffedf8,iVar6,in_stack_ffffffffffffede8._M_current);
        __cxa_throw(uVar16,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    bVar2 = version_struct::operator>=
                      ((version_struct *)in_stack_ffffffffffffedf0._M_current,
                       (char *)in_stack_ffffffffffffede8._M_current);
    if (bVar2) {
      io_buf::verify_hash(local_10,false);
    }
    std::__cxx11::stringstream::~stringstream(local_200);
  }
  free(local_30);
  return;
}

Assistant:

void save_load_header(
    vw& all, io_buf& model_file, bool read, bool text, std::string& file_options, VW::config::options_i& options)
{
  char* buff2 = (char*)malloc(default_buf_size);
  size_t buf2_size = default_buf_size;

  try
  {
    if (model_file.files.size() > 0)
    {
      size_t bytes_read_write = 0;

      uint32_t v_length = (uint32_t)version.to_string().length() + 1;
      stringstream msg;
      msg << "Version " << version.to_string() << "\n";
      memcpy(buff2, version.to_string().c_str(), min(v_length, buf2_size));
      if (read)
      {
        v_length = (uint32_t)buf2_size;
        buff2[min(v_length, default_buf_size) - 1] = '\0';
      }
      bytes_read_write += bin_text_read_write(model_file, buff2, v_length, "", read, msg, text);
      all.model_file_ver = buff2;  // stored in all to check save_resume fix in gd
      VW::validate_version(all);

      if (all.model_file_ver >= VERSION_FILE_WITH_HEADER_CHAINED_HASH)
        model_file.verify_hash(true);

      if (all.model_file_ver >= VERSION_FILE_WITH_HEADER_ID)
      {
        v_length = (uint32_t)all.id.length() + 1;

        msg << "Id " << all.id << "\n";
        memcpy(buff2, all.id.c_str(), min(v_length, default_buf_size));
        if (read)
          v_length = default_buf_size;
        bytes_read_write += bin_text_read_write(model_file, buff2, v_length, "", read, msg, text);
        all.id = buff2;

        if (read && !options.was_supplied("id") && !all.id.empty())
        {
          file_options += " --id";
          file_options += " " + all.id;
        }
      }

      char model = 'm';

      bytes_read_write +=
          bin_text_read_write_fixed_validated(model_file, &model, 1, "file is not a model file", read, msg, text);

      msg << "Min label:" << all.sd->min_label << "\n";
      bytes_read_write += bin_text_read_write_fixed_validated(
          model_file, (char*)&all.sd->min_label, sizeof(all.sd->min_label), "", read, msg, text);

      msg << "Max label:" << all.sd->max_label << "\n";
      bytes_read_write += bin_text_read_write_fixed_validated(
          model_file, (char*)&all.sd->max_label, sizeof(all.sd->max_label), "", read, msg, text);

      msg << "bits:" << all.num_bits << "\n";
      uint32_t local_num_bits = all.num_bits;
      bytes_read_write += bin_text_read_write_fixed_validated(
          model_file, (char*)&local_num_bits, sizeof(local_num_bits), "", read, msg, text);

      if (read && !options.was_supplied("bit_precision"))
      {
        file_options += " --bit_precision";
        std::stringstream temp;
        temp << local_num_bits;
        file_options += " " + temp.str();
      }

      VW::validate_default_bits(all, local_num_bits);

      all.default_bits = false;
      all.num_bits = local_num_bits;

      VW::validate_num_bits(all);

      if (all.model_file_ver < VERSION_FILE_WITH_INTERACTIONS_IN_FO)
      {
        // -q, --cubic and --interactions are not saved in vw::file_options
        uint32_t pair_len = (uint32_t)all.pairs.size();

        msg << pair_len << " pairs: ";
        bytes_read_write +=
            bin_text_read_write_fixed_validated(model_file, (char*)&pair_len, sizeof(pair_len), "", read, msg, text);

        // TODO: validate pairs?
        for (size_t i = 0; i < pair_len; i++)
        {
          char pair[3] = {0, 0, 0};

          if (!read)
          {
            memcpy(pair, all.pairs[i].c_str(), 2);
            msg << all.pairs[i] << " ";
          }

          bytes_read_write += bin_text_read_write_fixed_validated(model_file, pair, 2, "", read, msg, text);
          if (read)
          {
            string temp(pair);
            if (count(all.pairs.begin(), all.pairs.end(), temp) == 0)
              all.pairs.push_back(temp);
          }
        }

        msg << "\n";
        bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);

        uint32_t triple_len = (uint32_t)all.triples.size();

        msg << triple_len << " triples: ";
        bytes_read_write += bin_text_read_write_fixed_validated(
            model_file, (char*)&triple_len, sizeof(triple_len), "", read, msg, text);

        // TODO: validate triples?
        for (size_t i = 0; i < triple_len; i++)
        {
          char triple[4] = {0, 0, 0, 0};

          if (!read)
          {
            msg << all.triples[i] << " ";
            memcpy(triple, all.triples[i].c_str(), 3);
          }
          bytes_read_write += bin_text_read_write_fixed_validated(model_file, triple, 3, "", read, msg, text);
          if (read)
          {
            string temp(triple);
            if (count(all.triples.begin(), all.triples.end(), temp) == 0)
              all.triples.push_back(temp);
          }
        }

        msg << "\n";
        bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);

        if (all.model_file_ver >=
            VERSION_FILE_WITH_INTERACTIONS)  // && < VERSION_FILE_WITH_INTERACTIONS_IN_FO (previous if)
        {
          // the only version that saves interacions among pairs and triples
          uint32_t len = (uint32_t)all.interactions.size();

          msg << len << " interactions: ";
          bytes_read_write +=
              bin_text_read_write_fixed_validated(model_file, (char*)&len, sizeof(len), "", read, msg, text);

          for (size_t i = 0; i < len; i++)
          {
            uint32_t inter_len = 0;
            if (!read)
            {
              inter_len = (uint32_t)all.interactions[i].size();
              msg << "len: " << inter_len << " ";
            }
            bytes_read_write += bin_text_read_write_fixed_validated(
                model_file, (char*)&inter_len, sizeof(inter_len), "", read, msg, text);
            if (!read)
            {
              memcpy(buff2, all.interactions[i].c_str(), inter_len);

              msg << "interaction: ";
              msg.write(all.interactions[i].c_str(), inter_len);
            }

            bytes_read_write += bin_text_read_write_fixed_validated(model_file, buff2, inter_len, "", read, msg, text);

            if (read)
            {
              string temp(buff2, inter_len);
              all.interactions.push_back(temp);
            }
          }

          msg << "\n";
          bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);
        }
        else  // < VERSION_FILE_WITH_INTERACTIONS
        {
          // pairs and triples may be restored but not reflected in interactions
          all.interactions.insert(std::end(all.interactions), std::begin(all.pairs), std::end(all.pairs));
          all.interactions.insert(std::end(all.interactions), std::begin(all.triples), std::end(all.triples));
        }
      }

      if (all.model_file_ver <= VERSION_FILE_WITH_RANK_IN_HEADER)
      {
        // to fix compatibility that was broken in 7.9
        uint32_t rank = 0;
        msg << "rank:" << rank << "\n";
        bytes_read_write +=
            bin_text_read_write_fixed_validated(model_file, (char*)&rank, sizeof(rank), "", read, msg, text);
        if (rank != 0)
        {
          if (!options.was_supplied("rank"))
          {
            file_options += " --rank";
            std::stringstream temp;
            temp << rank;
            file_options += " " + temp.str();
          }
          else
            all.trace_message << "WARNING: this model file contains 'rank: " << rank
                              << "' value but it will be ignored as another value specified via the command line."
                              << endl;
        }
      }

      msg << "lda:" << all.lda << "\n";
      bytes_read_write +=
          bin_text_read_write_fixed_validated(model_file, (char*)&all.lda, sizeof(all.lda), "", read, msg, text);

      // TODO: validate ngram_len?
      uint32_t ngram_len = (uint32_t)all.ngram_strings.size();
      msg << ngram_len << " ngram:";
      bytes_read_write +=
          bin_text_read_write_fixed_validated(model_file, (char*)&ngram_len, sizeof(ngram_len), "", read, msg, text);
      for (size_t i = 0; i < ngram_len; i++)
      {
        // have '\0' at the end for sure
        char ngram[4] = {0, 0, 0, 0};
        if (!read)
        {
          msg << all.ngram_strings[i] << " ";
          memcpy(ngram, all.ngram_strings[i].c_str(), min(3, all.ngram_strings[i].size()));
        }
        bytes_read_write += bin_text_read_write_fixed_validated(model_file, ngram, 3, "", read, msg, text);
        if (read)
        {
          std::string temp(ngram);
          all.ngram_strings.push_back(temp);

          file_options += " --ngram";
          file_options += " " + temp;
        }
      }

      msg << "\n";
      bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);

      // TODO: validate skips?
      uint32_t skip_len = (uint32_t)all.skip_strings.size();
      msg << skip_len << " skip:";
      bytes_read_write +=
          bin_text_read_write_fixed_validated(model_file, (char*)&skip_len, sizeof(skip_len), "", read, msg, text);

      for (size_t i = 0; i < skip_len; i++)
      {
        char skip[4] = {0, 0, 0, 0};
        if (!read)
        {
          msg << all.skip_strings[i] << " ";
          memcpy(skip, all.skip_strings[i].c_str(), min(3, all.skip_strings[i].size()));
        }

        bytes_read_write += bin_text_read_write_fixed_validated(model_file, skip, 3, "", read, msg, text);
        if (read)
        {
          std::string temp(skip);
          all.skip_strings.push_back(temp);

          file_options += " --skips";
          file_options += " " + temp;
        }
      }
      msg << "\n";
      bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);

      if (read)
      {
        uint32_t len;
        size_t ret = model_file.bin_read_fixed((char*)&len, sizeof(len), "");
        if (len > 104857600 /*sanity check: 100 Mb*/ || ret < sizeof(uint32_t))
          THROW("bad model format!");
        resize_buf_if_needed(buff2, buf2_size, len);
        bytes_read_write += model_file.bin_read_fixed(buff2, len, "") + ret;

        // Write out file options to caller.
        if (len > 0)
        {
          // There is a potential bug here if len is read out to be zero (e.g. corrupted file). If we naively
          // append buff2 into file_options it might contain old information and thus be invalid. Before, what
          // probably happened is boost::program_options did the right thing, but now we have to construct the
          // input to it where we do not know whether a particular option key can have multiple values or not.
          //
          // In some cases we end up with a string like: "--bit_precision 18 <something_not_an_int>", which will
          // cause a "bad program options value" exception, rather than the true "file is corrupted" issue. Only
          // pushing the contents of buff2 into file_options when it is valid will prevent this false error.
          file_options = file_options + " " + buff2;
        }
      }
      else
      {
        VW::config::options_serializer_boost_po serializer;
        for (auto const& option : options.get_all_options())
        {
          if (option->m_keep && options.was_supplied(option->m_name))
          {
            serializer.add(*option);
          }
        }

        auto serialized_keep_options = serializer.str();

        // We need to save our current PRG state
        if (all.save_resume && all.random_state != 0)
        {
          serialized_keep_options += " --random_seed";
          serialized_keep_options += " " + std::to_string(all.random_state);
        }

        msg << "options:" << serialized_keep_options << "\n";

        uint32_t len = (uint32_t)serialized_keep_options.length();
        if (len > 0)
          safe_memcpy(buff2, buf2_size, serialized_keep_options.c_str(), len + 1);
        *(buff2 + len) = 0;
        bytes_read_write += bin_text_read_write(model_file, buff2, len + 1,  // len+1 to write a \0
            "", read, msg, text);
      }

      // Read/write checksum if required by version
      if (all.model_file_ver >= VERSION_FILE_WITH_HEADER_HASH)
      {
        uint32_t check_sum = (all.model_file_ver >= VERSION_FILE_WITH_HEADER_CHAINED_HASH)
            ? model_file.hash()
            : (uint32_t)uniform_hash(model_file.space.begin(), bytes_read_write, 0);

        uint32_t check_sum_saved = check_sum;

        msg << "Checksum: " << check_sum << "\n";
        bin_text_read_write(model_file, (char*)&check_sum, sizeof(check_sum), "", read, msg, text);

        if (check_sum_saved != check_sum)
          THROW("Checksum is inconsistent, file is possibly corrupted.");
      }

      if (all.model_file_ver >= VERSION_FILE_WITH_HEADER_CHAINED_HASH)
      {
        model_file.verify_hash(false);
      }
    }
  }
  catch (...)
  {
    free(buff2);
    throw;
  }

  free(buff2);
}